

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int compare_patches_internal
              (int me,double eps,int ndim,double *array1,int *lo1,int *hi1,int *dims1,double *array2
              ,int *lo2,int *hi2,int *dims2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int subscr2 [7];
  int subscr1 [7];
  char val [48];
  char msg [48];
  int *dims;
  
  dims = hi1;
  iVar1 = Index(ndim,lo1,dims1);
  iVar2 = Index(ndim,lo2,dims2);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < ndim) {
    uVar6 = (ulong)(uint)ndim;
  }
  iVar12 = 1;
  while( true ) {
    if (uVar6 == uVar5) {
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar8 = 0;
      lVar14 = 0;
      lVar11 = 0;
      while( true ) {
        if (iVar12 == iVar8) {
          return 0;
        }
        iVar3 = Index(ndim,subscr1,dims1);
        iVar4 = Index(ndim,subscr2,dims2);
        if (iVar8 == 0) {
          lVar11 = (long)iVar4;
          lVar14 = (long)iVar3;
        }
        lVar7 = iVar3 - lVar14;
        lVar13 = iVar4 - lVar11;
        dVar15 = array1[iVar1 + lVar7];
        dVar16 = array2[iVar2 + lVar13];
        dVar18 = -dVar15;
        dVar17 = dVar18;
        if (dVar18 <= dVar15) {
          dVar17 = dVar15;
        }
        dVar19 = -dVar16;
        dVar20 = dVar19;
        if (dVar19 <= dVar16) {
          dVar20 = dVar16;
        }
        if (dVar20 <= dVar17) {
          dVar17 = dVar15;
          if (dVar15 < 0.0) {
            dVar17 = dVar18;
          }
        }
        else {
          dVar17 = dVar16;
          if (dVar16 < 0.0) {
            dVar17 = dVar19;
          }
        }
        dVar15 = dVar15 - dVar16;
        dVar16 = -dVar15;
        if (-dVar15 <= dVar15) {
          dVar16 = dVar15;
        }
        if (eps < dVar16 / (double)(-(ulong)(dVar17 == 0.0) & 0x3ff0000000000000 |
                                   ~-(ulong)(dVar17 == 0.0) &
                                   (~-(ulong)(dVar17 < eps) & (ulong)dVar17 |
                                   -(ulong)(dVar17 < eps) & 0x3ff0000000000000))) break;
        update_subscript(ndim,subscr1,lo1,hi1,dims);
        update_subscript(ndim,subscr2,lo2,hi2,dims);
        iVar8 = iVar8 + 1;
      }
      sprintf(msg,"ERROR (proc=%d): a",(ulong)(uint)me);
      sprintf(val,"=%f, ",array1[iVar1 + lVar7]);
      print_subscript(msg,ndim,subscr1,val);
      sprintf(msg,"=%f\n",array2[iVar2 + lVar13]);
      print_subscript(" b",ndim,subscr2,msg);
      sleep(1);
      return 1;
    }
    uVar9 = hi1[uVar5] - lo1[uVar5];
    iVar8 = lo2[uVar5];
    uVar10 = hi2[uVar5] - iVar8;
    dims = (int *)(ulong)uVar10;
    if (uVar9 != uVar10) {
      __assert_fail("diff == (hi2[i]-lo2[i])",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,0xde,
                    "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                   );
    }
    if (dims1[uVar5] <= (int)uVar9) break;
    if (dims2[uVar5] <= (int)uVar9) {
      __assert_fail("diff < dims2[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,0xe0,
                    "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                   );
    }
    iVar12 = iVar12 * (uVar9 + 1);
    subscr1[uVar5] = lo1[uVar5];
    subscr2[uVar5] = iVar8;
    uVar5 = uVar5 + 1;
  }
  __assert_fail("diff < dims1[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0xdf,
                "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
               );
}

Assistant:

int compare_patches_internal(int me, double eps, int ndim, double *array1, 
                     int lo1[], int hi1[], int dims1[],
             double *array2, int lo2[], int hi2[], 
                     int dims2[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM], subscr2[GA_MAX_DIM];
    double diff,max;
    double *patch1, *patch2;
    Integer idx1, idx2, offset1=0, offset2=0;

        /* compute pointer to first element in patch */ 
    patch1 = array1 +  Index(ndim, lo1, dims1);    
    patch2 = array2 +  Index(ndim, lo2, dims2);    

        /* count # of elements & verify consistency of both patches */
    for(i=0;i<ndim;i++){  
        Integer diff = hi1[i]-lo1[i];
        assert(diff == (hi2[i]-lo2[i]));
        assert(diff < dims1[i]);
        assert(diff < dims2[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
        subscr2[i]=lo2[i];
    }

    /* compare element values in both patches */ 
    for(j=0; j< elems; j++){ 
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    
        idx2 = Index(ndim, subscr2, dims2);

        if(j==0){
            offset1 =idx1;
            offset2 =idx2;
        }
        idx1 -= offset1;
        idx2 -= offset2;

                diff = patch1[idx1] - patch2[idx2];
                max  = GA_MAX(GA_ABS(patch1[idx1]),GA_ABS(patch2[idx2]));
                if(max == 0. || max <eps) max = 1.; 

        if(eps < GA_ABS(diff)/max){
            char msg[48], val[48];
            sprintf(msg,"ERROR (proc=%d): a",me);
            sprintf(val,"=%f, ",patch1[idx1]);
            print_subscript(msg,ndim,subscr1,val);
            sprintf(msg,"=%f\n",patch2[idx2]);
            print_subscript(" b",ndim,subscr2,msg);
                        sleep(1);
                        return(1);
        }

        { /* update subscript for the patches */
           update_subscript(ndim, subscr1, lo1,hi1, dims1);
           update_subscript(ndim, subscr2, lo2,hi2, dims2);
        }
    }

        return(0);
}